

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::GlyphRangesBuilder::AddRanges(GlyphRangesBuilder *this,ImWchar *ranges)

{
  ushort local_1a;
  ImWchar *pIStack_18;
  ImWchar c;
  ImWchar *ranges_local;
  GlyphRangesBuilder *this_local;
  
  for (pIStack_18 = ranges; *pIStack_18 != 0; pIStack_18 = pIStack_18 + 2) {
    for (local_1a = *pIStack_18; local_1a <= pIStack_18[1]; local_1a = local_1a + 1) {
      AddChar(this,local_1a);
    }
  }
  return;
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}